

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * __thiscall
nlohmann::json_abi_v3_11_3::detail::parse_error::position_string_abi_cxx11_
          (string *__return_storage_ptr__,parse_error *this,position_t *pos)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong uVar6;
  string __str;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar6 = *(long *)&(this->super_exception).m + 1;
  uVar4 = 1;
  uVar5 = 1;
  if (9 < uVar6) {
    uVar3 = uVar6;
    uVar2 = 4;
    do {
      uVar5 = uVar2;
      if (uVar3 < 100) {
        uVar5 = uVar5 - 2;
        goto LAB_0031ddfc;
      }
      if (uVar3 < 1000) {
        uVar5 = uVar5 - 1;
        goto LAB_0031ddfc;
      }
      if (uVar3 < 10000) goto LAB_0031ddfc;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      uVar2 = uVar5 + 4;
    } while (bVar1);
    uVar5 = uVar5 + 1;
  }
LAB_0031ddfc:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)uVar5,'\0');
  CLI::std::__detail::__to_chars_10_impl<unsigned_long>
            (local_70._M_dataplus._M_p,(uint)local_70._M_string_length,uVar6);
  uVar6 = *(ulong *)&(this->super_exception).id;
  if (9 < uVar6) {
    uVar3 = uVar6;
    uVar5 = 4;
    do {
      uVar4 = uVar5;
      if (uVar3 < 100) {
        uVar4 = uVar4 - 2;
        goto LAB_0031de76;
      }
      if (uVar3 < 1000) {
        uVar4 = uVar4 - 1;
        goto LAB_0031de76;
      }
      if (uVar3 < 10000) goto LAB_0031de76;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      uVar5 = uVar4 + 4;
    } while (bVar1);
    uVar4 = uVar4 + 1;
  }
LAB_0031de76:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)uVar4,'\0');
  CLI::std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,uVar6);
  concat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[10],std::__cxx11::string>
            (__return_storage_ptr__,(detail *)" at line ",(char (*) [10])&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", column ",
             (char (*) [10])&local_50,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return concat(" at line ", std::to_string(pos.lines_read + 1),
                      ", column ", std::to_string(pos.chars_read_current_line));
    }